

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall ProcessorGenerator::generate_factory(ProcessorGenerator *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  string if_factory_name;
  ProcessorGenerator *this_local;
  
  if_factory_name.field_2._8_8_ = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &this->if_name_,"Factory");
  poVar2 = std::operator<<(this->f_header_,(string *)&this->template_header_);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)&this->factory_class_name_);
  poVar2 = std::operator<<(poVar2," : public ::apache::thrift::");
  bVar1 = std::operator==(&this->style_,"Cob");
  pcVar3 = "TProcessorFactory";
  if (bVar1) {
    pcVar3 = "async::TAsyncProcessorFactory";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," {");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2," public:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_up(this);
  poVar2 = this->f_header_;
  indent_abi_cxx11_(&local_60,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,(string *)&this->factory_class_name_);
  poVar2 = std::operator<<(poVar2,"(const ::std::shared_ptr< ");
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  poVar2 = std::operator<<(poVar2," >& handlerFactory) noexcept :");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_80,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2,"    handlerFactory_(handlerFactory) {}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_a0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,"::std::shared_ptr< ::apache::thrift::");
  bVar1 = std::operator==(&this->style_,"Cob");
  pcVar3 = "TProcessor";
  if (bVar1) {
    pcVar3 = "async::TAsyncProcessor";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," > ");
  poVar2 = std::operator<<(poVar2,
                           "getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = std::operator<<(this->f_header_,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2," protected:");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_c0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_c0);
  poVar2 = std::operator<<(poVar2,"::std::shared_ptr< ");
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  poVar2 = std::operator<<(poVar2," > handlerFactory_;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c0);
  indent_down(this);
  poVar2 = std::operator<<(this->f_header_,"};");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if ((this->generator_->gen_templates_ & 1U) != 0) {
    poVar2 = std::operator<<(this->f_header_,"typedef ");
    poVar2 = std::operator<<(poVar2,(string *)&this->factory_class_name_);
    poVar2 = std::operator<<(poVar2,"< ::apache::thrift::protocol::TDummyProtocol > ");
    poVar2 = std::operator<<(poVar2,(string *)&this->service_name_);
    poVar2 = std::operator<<(poVar2,(string *)&this->pstyle_);
    poVar2 = std::operator<<(poVar2,"ProcessorFactory;");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  poVar2 = std::operator<<(this->f_out_,(string *)&this->template_header_);
  indent_abi_cxx11_(&local_e0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_e0);
  poVar2 = std::operator<<(poVar2,"::std::shared_ptr< ::apache::thrift::");
  bVar1 = std::operator==(&this->style_,"Cob");
  pcVar3 = "TProcessor";
  if (bVar1) {
    pcVar3 = "async::TAsyncProcessor";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," > ");
  poVar2 = std::operator<<(poVar2,(string *)&this->factory_class_name_);
  poVar2 = std::operator<<(poVar2,(string *)&this->template_suffix_);
  poVar2 = std::operator<<(poVar2,"::getProcessor(");
  poVar2 = std::operator<<(poVar2,"const ::apache::thrift::TConnectionInfo& connInfo) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e0);
  indent_up(this);
  poVar2 = this->f_out_;
  indent_abi_cxx11_(&local_100,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_100);
  poVar2 = std::operator<<(poVar2,"::apache::thrift::ReleaseHandler< ");
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  poVar2 = std::operator<<(poVar2," > cleanup(handlerFactory_);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_120,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_120);
  poVar2 = std::operator<<(poVar2,"::std::shared_ptr< ");
  poVar2 = std::operator<<(poVar2,(string *)&this->if_name_);
  poVar2 = std::operator<<(poVar2," > handler(");
  poVar2 = std::operator<<(poVar2,"handlerFactory_->getHandler(connInfo), cleanup);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_140,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_140);
  poVar2 = std::operator<<(poVar2,"::std::shared_ptr< ::apache::thrift::");
  bVar1 = std::operator==(&this->style_,"Cob");
  pcVar3 = "TProcessor";
  if (bVar1) {
    pcVar3 = "async::TAsyncProcessor";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," > ");
  poVar2 = std::operator<<(poVar2,"processor(new ");
  poVar2 = std::operator<<(poVar2,(string *)&this->class_name_);
  poVar2 = std::operator<<(poVar2,(string *)&this->template_suffix_);
  poVar2 = std::operator<<(poVar2,"(handler));");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_160,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_160);
  poVar2 = std::operator<<(poVar2,"return processor;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  indent_down(this);
  poVar2 = this->f_out_;
  indent_abi_cxx11_(&local_180,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_180);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ProcessorGenerator::generate_factory() {
  string if_factory_name = if_name_ + "Factory";

  // Generate the factory class definition
  f_header_ << template_header_ << "class " << factory_class_name_ << " : public ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessorFactory" : "TProcessorFactory") << " {"
            << endl << " public:" << endl;
  indent_up();

  f_header_ << indent() << factory_class_name_ << "(const ::std::shared_ptr< " << if_factory_name
            << " >& handlerFactory) noexcept :" << endl << indent()
            << "    handlerFactory_(handlerFactory) {}" << endl << endl << indent()
            << "::std::shared_ptr< ::apache::thrift::"
            << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
            << "getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) override;"
            << endl;

  f_header_ << endl << " protected:" << endl << indent() << "::std::shared_ptr< "
            << if_factory_name << " > handlerFactory_;" << endl;

  indent_down();
  f_header_ << "};" << endl << endl;

  // If we are generating templates, output a typedef for the plain
  // factory name.
  if (generator_->gen_templates_) {
    f_header_ << "typedef " << factory_class_name_
              << "< ::apache::thrift::protocol::TDummyProtocol > " << service_name_ << pstyle_
              << "ProcessorFactory;" << endl << endl;
  }

  // Generate the getProcessor() method
  f_out_ << template_header_ << indent() << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << factory_class_name_ << template_suffix_ << "::getProcessor("
         << "const ::apache::thrift::TConnectionInfo& connInfo) {" << endl;
  indent_up();

  f_out_ << indent() << "::apache::thrift::ReleaseHandler< " << if_factory_name
         << " > cleanup(handlerFactory_);" << endl << indent() << "::std::shared_ptr< "
         << if_name_ << " > handler("
         << "handlerFactory_->getHandler(connInfo), cleanup);" << endl << indent()
         << "::std::shared_ptr< ::apache::thrift::"
         << (style_ == "Cob" ? "async::TAsyncProcessor" : "TProcessor") << " > "
         << "processor(new " << class_name_ << template_suffix_ << "(handler));" << endl << indent()
         << "return processor;" << endl;

  indent_down();
  f_out_ << indent() << "}" << endl << endl;
}